

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FLog.cpp
# Opt level: O1

void FLog::mWarning(time_t dateTime,int line,string *function,string *file,string *text)

{
  pointer pcVar1;
  uint uVar2;
  int iVar3;
  pthread_t pVar4;
  char *pcVar5;
  long *plVar6;
  undefined8 *puVar7;
  ostream *poVar8;
  undefined8 uVar9;
  uint uVar10;
  long *plVar11;
  ulong *puVar12;
  string *psVar13;
  size_type *psVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  string __str;
  string temp;
  string __str_1;
  string timeTemp;
  string threadIdStr;
  mutex locker;
  ostringstream sstream;
  ulong *local_580;
  long local_578;
  ulong local_570 [2];
  ulong *local_560;
  long local_558;
  ulong local_550;
  long lStack_548;
  long *local_540;
  undefined8 local_538;
  long local_530;
  undefined8 uStack_528;
  string *local_520;
  string *local_518;
  long *local_510;
  long local_508;
  long local_500;
  long lStack_4f8;
  time_t local_4f0;
  long *local_4e8;
  long local_4e0;
  long local_4d8;
  long lStack_4d0;
  long *local_4c8;
  long local_4c0;
  long local_4b8;
  long lStack_4b0;
  long *local_4a8;
  long local_4a0;
  long local_498;
  long lStack_490;
  long *local_488;
  long local_480;
  long local_478;
  long lStack_470;
  long *local_468;
  long local_460;
  long local_458;
  long lStack_450;
  long *local_448;
  long local_440;
  long local_438;
  long lStack_430;
  long *local_428;
  long local_420;
  long local_418;
  long lStack_410;
  long *local_408;
  long local_400;
  long local_3f8;
  long lStack_3f0;
  long *local_3e8;
  long local_3e0;
  long local_3d8;
  long lStack_3d0;
  string local_3c8;
  string *local_3a8;
  long local_3a0;
  string local_398;
  long local_378;
  long lStack_370;
  long *local_368;
  long local_360;
  long local_358;
  long lStack_350;
  long *local_348;
  long local_340;
  long local_338;
  long lStack_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  long *local_2a8;
  long local_298 [2];
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  undefined1 local_248 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Alloc_hider local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_518 = text;
  local_4f0 = dateTime;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pVar4 = pthread_self();
  if (pVar4 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"thread::id of a non-executing thread",0x24);
  }
  else {
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  }
  std::__cxx11::stringbuf::str();
  if (1 < (int)logLevel) goto LAB_00107825;
  if (printAll != false || printWarning != false) {
    pcVar5 = ctime(&local_4f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,pcVar5,(allocator<char> *)local_248);
    std::__cxx11::string::replace
              ((ulong)&local_328,local_328._M_string_length - 1,(char *)0x1,0x10e15d);
    std::operator+(&local_268," [DateTime: ",&local_328);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_268);
    local_4e8 = &local_4d8;
    plVar11 = plVar6 + 2;
    if ((long *)*plVar6 == plVar11) {
      local_4d8 = *plVar11;
      lStack_4d0 = plVar6[3];
    }
    else {
      local_4d8 = *plVar11;
      local_4e8 = (long *)*plVar6;
    }
    local_4e0 = plVar6[1];
    *plVar6 = (long)plVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_4e8);
    local_4c8 = &local_4b8;
    plVar11 = plVar6 + 2;
    if ((long *)*plVar6 == plVar11) {
      local_4b8 = *plVar11;
      lStack_4b0 = plVar6[3];
    }
    else {
      local_4b8 = *plVar11;
      local_4c8 = (long *)*plVar6;
    }
    local_4c0 = plVar6[1];
    *plVar6 = (long)plVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_4c8);
    local_560 = &local_550;
    puVar12 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar12) {
      local_550 = *puVar12;
      lStack_548 = plVar6[3];
    }
    else {
      local_550 = *puVar12;
      local_560 = (ulong *)*plVar6;
    }
    local_558 = plVar6[1];
    *plVar6 = (long)puVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    uVar16 = -line;
    if (0 < line) {
      uVar16 = line;
    }
    uVar17 = 1;
    if (9 < uVar16) {
      uVar15 = (ulong)uVar16;
      uVar2 = 4;
      do {
        uVar17 = uVar2;
        uVar10 = (uint)uVar15;
        if (uVar10 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_00106c76;
        }
        if (uVar10 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_00106c76;
        }
        if (uVar10 < 10000) goto LAB_00106c76;
        uVar15 = uVar15 / 10000;
        uVar2 = uVar17 + 4;
      } while (99999 < uVar10);
      uVar17 = uVar17 + 1;
    }
LAB_00106c76:
    local_580 = local_570;
    std::__cxx11::string::_M_construct((ulong)&local_580,(char)-(line >> 0x1f) + (char)uVar17);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uint)-(line >> 0x1f) + (long)local_580),uVar17,uVar16);
    uVar15 = 0xf;
    if (local_560 != &local_550) {
      uVar15 = local_550;
    }
    if (uVar15 < (ulong)(local_578 + local_558)) {
      uVar15 = 0xf;
      if (local_580 != local_570) {
        uVar15 = local_570[0];
      }
      if (uVar15 < (ulong)(local_578 + local_558)) goto LAB_00106cf2;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_580,0,(char *)0x0,(ulong)local_560);
    }
    else {
LAB_00106cf2:
      puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_560,(ulong)local_580);
    }
    local_540 = &local_530;
    plVar6 = puVar7 + 2;
    if ((long *)*puVar7 == plVar6) {
      local_530 = *plVar6;
      uStack_528 = puVar7[3];
    }
    else {
      local_530 = *plVar6;
      local_540 = (long *)*puVar7;
    }
    local_538 = puVar7[1];
    *puVar7 = plVar6;
    puVar7[1] = 0;
    *(undefined1 *)plVar6 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_540);
    local_4a8 = &local_498;
    plVar11 = plVar6 + 2;
    if ((long *)*plVar6 == plVar11) {
      local_498 = *plVar11;
      lStack_490 = plVar6[3];
    }
    else {
      local_498 = *plVar11;
      local_4a8 = (long *)*plVar6;
    }
    local_4a0 = plVar6[1];
    *plVar6 = (long)plVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_4a8);
    local_488 = &local_478;
    plVar11 = plVar6 + 2;
    if ((long *)*plVar6 == plVar11) {
      local_478 = *plVar11;
      lStack_470 = plVar6[3];
    }
    else {
      local_478 = *plVar11;
      local_488 = (long *)*plVar6;
    }
    local_480 = plVar6[1];
    *plVar6 = (long)plVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_488,(ulong)(function->_M_dataplus)._M_p);
    local_468 = &local_458;
    plVar11 = plVar6 + 2;
    if ((long *)*plVar6 == plVar11) {
      local_458 = *plVar11;
      lStack_450 = plVar6[3];
    }
    else {
      local_458 = *plVar11;
      local_468 = (long *)*plVar6;
    }
    local_460 = plVar6[1];
    *plVar6 = (long)plVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_468);
    local_448 = &local_438;
    plVar11 = plVar6 + 2;
    if ((long *)*plVar6 == plVar11) {
      local_438 = *plVar11;
      lStack_430 = plVar6[3];
    }
    else {
      local_438 = *plVar11;
      local_448 = (long *)*plVar6;
    }
    local_440 = plVar6[1];
    *plVar6 = (long)plVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_448);
    local_428 = &local_418;
    plVar11 = plVar6 + 2;
    if ((long *)*plVar6 == plVar11) {
      local_418 = *plVar11;
      lStack_410 = plVar6[3];
    }
    else {
      local_418 = *plVar11;
      local_428 = (long *)*plVar6;
    }
    local_420 = plVar6[1];
    *plVar6 = (long)plVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_428,(ulong)local_2a8);
    local_408 = &local_3f8;
    plVar11 = plVar6 + 2;
    if ((long *)*plVar6 == plVar11) {
      local_3f8 = *plVar11;
      lStack_3f0 = plVar6[3];
    }
    else {
      local_3f8 = *plVar11;
      local_408 = (long *)*plVar6;
    }
    local_400 = plVar6[1];
    *plVar6 = (long)plVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_520 = file;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_408);
    psVar13 = (string *)(plVar6 + 2);
    if ((string *)*plVar6 == psVar13) {
      local_398._M_dataplus._M_p = (psVar13->_M_dataplus)._M_p;
      local_398._M_string_length = plVar6[3];
      local_3a8 = &local_398;
    }
    else {
      local_398._M_dataplus._M_p = (psVar13->_M_dataplus)._M_p;
      local_3a8 = (string *)*plVar6;
    }
    local_3a0 = plVar6[1];
    *plVar6 = (long)psVar13;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_3a8);
    local_3e8 = &local_3d8;
    plVar11 = plVar6 + 2;
    if ((long *)*plVar6 == plVar11) {
      local_3d8 = *plVar11;
      lStack_3d0 = plVar6[3];
    }
    else {
      local_3d8 = *plVar11;
      local_3e8 = (long *)*plVar6;
    }
    local_3e0 = plVar6[1];
    *plVar6 = (long)plVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_3e8,(ulong)(local_520->_M_dataplus)._M_p);
    plVar11 = plVar6 + 2;
    if ((long *)*plVar6 == plVar11) {
      local_378 = *plVar11;
      lStack_370 = plVar6[3];
      local_398.field_2._M_allocated_capacity = (size_type)&local_378;
    }
    else {
      local_378 = *plVar11;
      local_398.field_2._M_allocated_capacity = (size_type)(long *)*plVar6;
    }
    local_398.field_2._8_8_ = plVar6[1];
    *plVar6 = (long)plVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append(local_398.field_2._M_local_buf);
    plVar11 = plVar6 + 2;
    if ((long *)*plVar6 == plVar11) {
      local_358 = *plVar11;
      lStack_350 = plVar6[3];
      local_368 = &local_358;
    }
    else {
      local_358 = *plVar11;
      local_368 = (long *)*plVar6;
    }
    local_360 = plVar6[1];
    *plVar6 = (long)plVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_368);
    plVar11 = plVar6 + 2;
    if ((long *)*plVar6 == plVar11) {
      local_338 = *plVar11;
      lStack_330 = plVar6[3];
      local_348 = &local_338;
    }
    else {
      local_338 = *plVar11;
      local_348 = (long *)*plVar6;
    }
    local_340 = plVar6[1];
    *plVar6 = (long)plVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_348,(ulong)(local_518->_M_dataplus)._M_p);
    psVar14 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar14) {
      local_248._16_8_ = *psVar14;
      local_248._24_8_ = plVar6[3];
      local_248._0_8_ = local_248 + 0x10;
    }
    else {
      local_248._16_8_ = *psVar14;
      local_248._0_8_ = (size_type *)*plVar6;
    }
    local_248._8_8_ = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append(local_248);
    local_510 = &local_500;
    plVar11 = plVar6 + 2;
    if ((long *)*plVar6 == plVar11) {
      local_500 = *plVar11;
      lStack_4f8 = plVar6[3];
    }
    else {
      local_500 = *plVar11;
      local_510 = (long *)*plVar6;
    }
    local_508 = plVar6[1];
    *plVar6 = (long)plVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
    if (local_348 != &local_338) {
      operator_delete(local_348,local_338 + 1);
    }
    if (local_368 != &local_358) {
      operator_delete(local_368,local_358 + 1);
    }
    if ((long *)local_398.field_2._M_allocated_capacity != &local_378) {
      operator_delete((void *)local_398.field_2._M_allocated_capacity,local_378 + 1);
    }
    if (local_3e8 != &local_3d8) {
      operator_delete(local_3e8,local_3d8 + 1);
    }
    if (local_3a8 != &local_398) {
      operator_delete(local_3a8,(ulong)(local_398._M_dataplus._M_p + 1));
    }
    file = local_520;
    if (local_408 != &local_3f8) {
      operator_delete(local_408,local_3f8 + 1);
    }
    if (local_428 != &local_418) {
      operator_delete(local_428,local_418 + 1);
    }
    if (local_448 != &local_438) {
      operator_delete(local_448,local_438 + 1);
    }
    if (local_468 != &local_458) {
      operator_delete(local_468,local_458 + 1);
    }
    if (local_488 != &local_478) {
      operator_delete(local_488,local_478 + 1);
    }
    if (local_4a8 != &local_498) {
      operator_delete(local_4a8,local_498 + 1);
    }
    if (local_540 != &local_530) {
      operator_delete(local_540,local_530 + 1);
    }
    if (local_580 != local_570) {
      operator_delete(local_580,local_570[0] + 1);
    }
    if (local_560 != &local_550) {
      operator_delete(local_560,local_550 + 1);
    }
    if (local_4c8 != &local_4b8) {
      operator_delete(local_4c8,local_4b8 + 1);
    }
    if (local_4e8 != &local_4d8) {
      operator_delete(local_4e8,local_4d8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    local_248._16_8_ = 0;
    local_248._24_8_ = (__pthread_internal_list *)0x0;
    local_248._0_8_ = (long *)0x0;
    local_248._8_8_ = 0;
    local_248._32_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)local_248);
    if (iVar3 != 0) {
      uVar9 = std::__throw_system_error(iVar3);
      if ((long *)local_248._0_8_ != &local_498) {
        operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
      }
      if (local_348 != &local_338) {
        operator_delete(local_348,local_338 + 1);
      }
      if (local_368 != &local_4d8) {
        operator_delete(local_368,local_358 + 1);
      }
      if ((long *)local_398.field_2._M_allocated_capacity != &local_478) {
        operator_delete((void *)local_398.field_2._M_allocated_capacity,local_378 + 1);
      }
      if (local_3e8 != &local_3d8) {
        operator_delete(local_3e8,local_3d8 + 1);
      }
      if (local_3a8 != file) {
        operator_delete(local_3a8,(ulong)(local_398._M_dataplus._M_p + 1));
      }
      if (local_408 != &local_3f8) {
        operator_delete(local_408,local_3f8 + 1);
      }
      if (local_428 != &local_418) {
        operator_delete(local_428,local_418 + 1);
      }
      if (local_448 != &local_438) {
        operator_delete(local_448,local_438 + 1);
      }
      if (local_468 != &local_458) {
        operator_delete(local_468,local_458 + 1);
      }
      if (local_488 != &local_478) {
        operator_delete(local_488,local_478 + 1);
      }
      if (local_4a8 != &local_498) {
        operator_delete(local_4a8,local_498 + 1);
      }
      if (local_540 != &local_530) {
        operator_delete(local_540,local_530 + 1);
      }
      if (local_580 != local_570) {
        operator_delete(local_580,local_570[0] + 1);
      }
      if (local_560 != &local_550) {
        operator_delete(local_560,local_550 + 1);
      }
      if (local_4c8 != &local_4b8) {
        operator_delete(local_4c8,local_4b8 + 1);
      }
      if (local_4e8 != &local_4d8) {
        operator_delete(local_4e8,local_4d8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      if (local_2a8 != local_298) {
        operator_delete(local_2a8,local_298[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      _Unwind_Resume(uVar9);
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::clog,(char *)local_510,local_508);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    pthread_mutex_unlock((pthread_mutex_t *)local_248);
    if (local_510 != &local_500) {
      operator_delete(local_510,local_500 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar5 = ctime(&local_4f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,pcVar5,(allocator<char> *)&local_328);
  uVar16 = -line;
  if (0 < line) {
    uVar16 = line;
  }
  uVar17 = 1;
  if (9 < uVar16) {
    uVar15 = (ulong)uVar16;
    uVar2 = 4;
    do {
      uVar17 = uVar2;
      uVar10 = (uint)uVar15;
      if (uVar10 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_001075f6;
      }
      if (uVar10 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_001075f6;
      }
      if (uVar10 < 10000) goto LAB_001075f6;
      uVar15 = uVar15 / 10000;
      uVar2 = uVar17 + 4;
    } while (99999 < uVar10);
    uVar17 = uVar17 + 1;
  }
LAB_001075f6:
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_3c8,(char)uVar17 - (char)(line >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_3c8._M_dataplus._M_p + ((uint)line >> 0x1f),uVar17,uVar16);
  pcVar1 = (file->_M_dataplus)._M_p;
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c8,pcVar1,pcVar1 + file->_M_string_length);
  pcVar1 = (local_518->_M_dataplus)._M_p;
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2e8,pcVar1,pcVar1 + local_518->_M_string_length);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"warning","");
  FONQRI::Log::Log((Log *)local_248,&local_288,&local_3c8,&local_2c8,&local_2e8,&local_308);
  std::vector<FONQRI::Log,_std::allocator<FONQRI::Log>_>::emplace_back<FONQRI::Log>
            (&normalLogList,(Log *)local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,local_1b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,local_1d8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_p != &local_1f8) {
    operator_delete(local_208._M_p,local_1f8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._32_8_ != &local_218) {
    operator_delete((void *)local_248._32_8_,local_218._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
LAB_00107825:
  if (local_2a8 != local_298) {
    operator_delete(local_2a8,local_298[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void FLog::mWarning(const time_t dateTime, int line, std::string function,
			std::string file, std::string text)
{

	// get thread id and convert it to string
	std::ostringstream sstream;
	sstream << std::this_thread::get_id();
	std::string threadIdStr = sstream.str();

	if (logLevel < FLog::important) {
		if (FLog::printWarning | FLog::printAll) {
			std::string timeTemp = std::string(std::ctime(&dateTime));
			timeTemp.replace(timeTemp.size() - 1, 1, "");
			std::string temp = " [DateTime: " + timeTemp + " ] " +
					   " [Type: Warning ] " + " [Line: " +
					   std::to_string(line) + " ] " +
					   " [Function: " + function + " ] " +
					   " [Thread Id: " + threadIdStr + " ] " +
					   " [File: " + file + " ] " + " [MSG: " +
					   text + " ] ";
			std::mutex locker;
			locker.lock();
			std::clog << temp << std::endl;
			locker.unlock();
		}
		FLog::normalLogList.push_back(
		FONQRI::Log(std::string(std::ctime(&dateTime)),
				std::to_string(line), file, text, "warning"));

		if (FLog::normalLogList.size() >= FLog::logCounts) {
			// NOTE you can save save normalLogList  to database
		}
	}
}